

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_assertion_tests.cpp
# Opt level: O1

void __thiscall
test::string_assertion_test::iu_StrCaseTest_x_iutest_x_EqRaw_Test<wchar_t>::Body
          (iu_StrCaseTest_x_iutest_x_EqRaw_Test<wchar_t> *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined *puVar2;
  wchar_t **in_R9;
  AssertionResult iutest_ar;
  allocator<char> local_1f9;
  AssertionResult local_1f8;
  AssertionHelper local_1d0;
  undefined1 local_1a0 [392];
  
  puVar2 = text<wchar_t>::test;
  local_1a0._0_8_ = text<wchar_t>::test;
  local_1d0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p = text<wchar_t>::test;
  iutest::internal::StrCaseEqHelper::Assertion<wchar_t_const*,wchar_t_const*>
            (&local_1f8,(StrCaseEqHelper *)"TestFixture::Text::test","p",local_1a0,
             (wchar_t **)&local_1d0,in_R9);
  if (local_1f8.m_result == false) {
    memset((iu_global_format_stringstream *)local_1a0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1a0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1d0,local_1f8.m_message._M_dataplus._M_p,&local_1f9);
    local_1d0.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/string_assertion_tests.cpp"
    ;
    local_1d0.m_part_result.super_iuCodeMessage.m_line = 0xad;
    local_1d0.m_part_result.super_iuCodeMessage._44_4_ = 2;
    iutest::AssertionHelper::OnFixed(&local_1d0,(Fixed *)local_1a0,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_1d0.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_1d0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_1d0.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1a0);
    std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x80));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8.m_message._M_dataplus._M_p == &local_1f8.m_message.field_2) {
      return;
    }
  }
  else {
    paVar1 = &local_1f8.m_message.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(local_1f8.m_message._M_dataplus._M_p,
                      local_1f8.m_message.field_2._M_allocated_capacity + 1);
    }
    local_1a0._0_8_ = text<wchar_t>::test;
    local_1d0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p = puVar2;
    iutest::internal::StrCaseEqHelper::Assertion<wchar_t_const*,wchar_t_const*>
              (&local_1f8,(StrCaseEqHelper *)"TestFixture::Text::test","p",local_1a0,
               (wchar_t **)&local_1d0,in_R9);
    if (local_1f8.m_result == false) {
      memset((iu_global_format_stringstream *)local_1a0,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)local_1a0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1d0,local_1f8.m_message._M_dataplus._M_p,&local_1f9);
      local_1d0.m_part_result.super_iuCodeMessage.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/string_assertion_tests.cpp"
      ;
      local_1d0.m_part_result.super_iuCodeMessage.m_line = 0xae;
      local_1d0.m_part_result.super_iuCodeMessage._44_4_ = 1;
      iutest::AssertionHelper::OnFixed(&local_1d0,(Fixed *)local_1a0,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
          &local_1d0.m_part_result.super_iuCodeMessage.m_message.field_2) {
        operator_delete(local_1d0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                        local_1d0.m_part_result.super_iuCodeMessage.m_message.field_2.
                        _M_allocated_capacity + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1a0);
      std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x80));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(local_1f8.m_message._M_dataplus._M_p,
                      local_1f8.m_message.field_2._M_allocated_capacity + 1);
    }
    local_1a0._0_8_ = text<wchar_t>::test;
    local_1d0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p = puVar2;
    iutest::internal::StrCaseEqHelper::Assertion<wchar_t_const*,wchar_t_const*>
              (&local_1f8,(StrCaseEqHelper *)"TestFixture::Text::test","p",local_1a0,
               (wchar_t **)&local_1d0,in_R9);
    if (local_1f8.m_result == false) {
      memset((iu_global_format_stringstream *)local_1a0,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)local_1a0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1d0,local_1f8.m_message._M_dataplus._M_p,&local_1f9);
      local_1d0.m_part_result.super_iuCodeMessage.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/string_assertion_tests.cpp"
      ;
      local_1d0.m_part_result.super_iuCodeMessage.m_line = 0xaf;
      local_1d0.m_part_result.super_iuCodeMessage._44_4_ = 0xffffffff;
      iutest::AssertionHelper::OnFixed(&local_1d0,(Fixed *)local_1a0,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
          &local_1d0.m_part_result.super_iuCodeMessage.m_message.field_2) {
        operator_delete(local_1d0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                        local_1d0.m_part_result.super_iuCodeMessage.m_message.field_2.
                        _M_allocated_capacity + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1a0);
      std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x80));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8.m_message._M_dataplus._M_p == paVar1) {
      return;
    }
  }
  operator_delete(local_1f8.m_message._M_dataplus._M_p,
                  local_1f8.m_message.field_2._M_allocated_capacity + 1);
  return;
}

Assistant:

IUTEST_TYPED_TEST(StrCaseTest, EqRaw)
{
    const TypeParam* p = TestFixture::Text::test;
    IUTEST_ASSERT_STRCASEEQ(TestFixture::Text::test, p);
    IUTEST_EXPECT_STRCASEEQ(TestFixture::Text::test, p);
    IUTEST_INFORM_STRCASEEQ(TestFixture::Text::test, p);
}